

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

int __thiscall uv11::listen(uv11 *this,int __fd,int __n)

{
  int iVar1;
  uv_stream_t *puVar2;
  _func_void_uv_stream_t_ptr_int *p_Var3;
  undefined4 in_register_00000014;
  error_code eVar4;
  __0 local_35;
  int local_34;
  function<void_(uv11::Stream_&,_std::error_code)> *pfStack_30;
  int s;
  ConnectionCb *connection_cb_local;
  Stream *pSStack_20;
  int backlog_local;
  Stream *stream_local;
  
  pfStack_30 = (function<void_(uv11::Stream_&,_std::error_code)> *)
               CONCAT44(in_register_00000014,__n);
  connection_cb_local._4_4_ = __fd;
  pSStack_20 = (Stream *)this;
  std::function<void_(uv11::Stream_&,_std::error_code)>::operator=
            ((function<void_(uv11::Stream_&,_std::error_code)> *)(this + 0x78),pfStack_30);
  puVar2 = Stream::GetStream(pSStack_20);
  iVar1 = connection_cb_local._4_4_;
  p_Var3 = listen(uv11::Stream&,int,std::function_const&)::$_0::operator_cast_to_function_pointer
                     (&local_35);
  local_34 = uv_listen(puVar2,iVar1,p_Var3);
  if (local_34 != 0) {
    std::function<void_(uv11::Stream_&,_std::error_code)>::operator=
              (&pSStack_20->on_connection,(nullptr_t)0x0);
  }
  eVar4 = make_error(local_34);
  return eVar4._M_value;
}

Assistant:

Error uv11::listen(Stream& stream, int backlog, ConnectionCb const& connection_cb) {
    stream.on_connection = connection_cb;

    int s = ::uv_listen(
        &stream.GetStream(),
        backlog,
        [](uv_stream_t* server, int status) {
            Stream* strm = reinterpret_cast<Stream*>(server->data);
            return strm->on_connection(*strm, make_error(status));
        }
    );

    if (s) stream.on_connection = nullptr;

    return make_error(s);
}